

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O1

void duckdb_je_sec_mutex_stats_read(tsdn_t *tsdn,sec_t *sec,mutex_prof_data_t *mutex_prof_data)

{
  long *plVar1;
  uint uVar2;
  sec_shard_t *psVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  nstime_t *a;
  ulong uVar7;
  
  if ((sec->opts).nshards != 0) {
    lVar6 = 0x48;
    uVar7 = 0;
    do {
      psVar3 = sec->shards;
      iVar5 = pthread_mutex_trylock((pthread_mutex_t *)((long)&(psVar3->mtx).field_0 + lVar6));
      if (iVar5 != 0) {
        duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)psVar3 + lVar6 + -0x48));
        *(undefined1 *)((long)psVar3 + lVar6 + -8) = 1;
      }
      plVar1 = (long *)((long)psVar3 + lVar6 + -0x10);
      *plVar1 = *plVar1 + 1;
      if (*(tsdn_t **)((long)psVar3 + lVar6 + -0x18) != tsdn) {
        *(tsdn_t **)((long)psVar3 + lVar6 + -0x18) = tsdn;
        plVar1 = (long *)((long)psVar3 + lVar6 + -0x20);
        *plVar1 = *plVar1 + 1;
      }
      psVar3 = sec->shards;
      duckdb_je_nstime_add
                (&mutex_prof_data->tot_wait_time,(nstime_t *)((long)psVar3 + lVar6 + -0x48));
      a = (nstime_t *)((long)psVar3 + lVar6 + -0x40);
      iVar5 = duckdb_je_nstime_compare(a,&mutex_prof_data->max_wait_time);
      if (0 < iVar5) {
        duckdb_je_nstime_copy(&mutex_prof_data->max_wait_time,a);
      }
      plVar1 = (long *)((long)psVar3 + lVar6 + -0x38);
      lVar4 = plVar1[1];
      mutex_prof_data->n_wait_times = mutex_prof_data->n_wait_times + *plVar1;
      mutex_prof_data->n_spin_acquired = mutex_prof_data->n_spin_acquired + lVar4;
      uVar2 = *(uint *)((long)psVar3 + lVar6 + -0x28);
      if (mutex_prof_data->max_n_thds < uVar2) {
        mutex_prof_data->max_n_thds = uVar2;
      }
      (mutex_prof_data->n_waiting_thds).repr = 0;
      mutex_prof_data->n_owner_switches =
           mutex_prof_data->n_owner_switches + *(long *)((long)psVar3 + lVar6 + -0x20);
      mutex_prof_data->n_lock_ops =
           mutex_prof_data->n_lock_ops + *(long *)((long)psVar3 + lVar6 + -0x10);
      psVar3 = sec->shards;
      *(undefined1 *)((long)psVar3 + lVar6 + -8) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(psVar3->mtx).field_0 + lVar6));
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (uVar7 < (sec->opts).nshards);
  }
  return;
}

Assistant:

void
sec_mutex_stats_read(tsdn_t *tsdn, sec_t *sec,
    mutex_prof_data_t *mutex_prof_data) {
	for (size_t i = 0; i < sec->opts.nshards; i++) {
		malloc_mutex_lock(tsdn, &sec->shards[i].mtx);
		malloc_mutex_prof_accum(tsdn, mutex_prof_data,
		    &sec->shards[i].mtx);
		malloc_mutex_unlock(tsdn, &sec->shards[i].mtx);
	}
}